

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

TaskPool * depspawn::get_task_pool(void)

{
  TaskPool *this;
  
  if (internal::TP == (TaskPool *)0x0) {
    this = (TaskPool *)operator_new(0x230);
    internal::TaskPool::TaskPool(this,internal::Nthreads + -1,4,true);
    internal::TP = this;
  }
  return internal::TP;
}

Assistant:

TaskPool& get_task_pool()
  {
#ifdef DEPSPAWN_USE_TBB
    static TaskPool Null_TP(0, 0, false);
    return Null_TP;
#else
    if(TP == nullptr) {
      TP = new TaskPool(Nthreads - 1, true);
      assert(Nthreads == (TP->nthreads() + 1));
    }
    return *TP;
#endif
  }